

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

int VP8PutBitUniform(VP8BitWriter *bw,int bit)

{
  uint uVar1;
  int in_ESI;
  uint *in_RDI;
  VP8BitWriter *unaff_retaddr;
  int split;
  
  uVar1 = (int)*in_RDI >> 1;
  if (in_ESI == 0) {
    *in_RDI = uVar1;
  }
  else {
    in_RDI[1] = uVar1 + 1 + in_RDI[1];
    *in_RDI = *in_RDI - (uVar1 + 1);
  }
  if ((int)*in_RDI < 0x7f) {
    *in_RDI = (uint)kNewRange[(int)*in_RDI];
    in_RDI[1] = in_RDI[1] << 1;
    in_RDI[3] = in_RDI[3] + 1;
    if (0 < (int)in_RDI[3]) {
      Flush(unaff_retaddr);
    }
  }
  return in_ESI;
}

Assistant:

int VP8PutBitUniform(VP8BitWriter* const bw, int bit) {
  const int split = bw->range >> 1;
  if (bit) {
    bw->value += split + 1;
    bw->range -= split + 1;
  } else {
    bw->range = split;
  }
  if (bw->range < 127) {
    bw->range = kNewRange[bw->range];
    bw->value <<= 1;
    bw->nb_bits += 1;
    if (bw->nb_bits > 0) Flush(bw);
  }
  return bit;
}